

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
syntax_tests::iu_TypedPrintToTest_x_iutest_x_Print_Test<int>::
~iu_TypedPrintToTest_x_iutest_x_Print_Test(iu_TypedPrintToTest_x_iutest_x_Print_Test<int> *this)

{
  iu_TypedPrintToTest_x_iutest_x_Print_Test<int> *this_local;
  
  ~iu_TypedPrintToTest_x_iutest_x_Print_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

IUTEST_TYPED_TEST(TypedPrintToTest, Print)
{
    TypeParam a = 0;
    TypeParam& b = a;
    const TypeParam c = a;
    const volatile TypeParam d = a;

    IUTEST_SUCCEED() << ::iutest::PrintToString(a);
    IUTEST_SUCCEED() << ::iutest::PrintToString(b);
    IUTEST_SUCCEED() << ::iutest::PrintToString(c);
    IUTEST_SUCCEED() << ::iutest::PrintToString(d);
}